

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

ostream * __thiscall absl::operator<<(absl *this,ostream *os,uint128 v)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  uint128 dividend;
  char cVar4;
  absl aVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  absl *paVar10;
  uint128 dividend_00;
  uint128 divisor;
  uint128 divisor_00;
  string rep;
  uint128 low;
  ostringstream os_1;
  undefined1 auStack_208 [8];
  uint64_t local_200;
  char *local_1f8;
  ulong local_1f0;
  char local_1e8 [16];
  uint128 local_1d8;
  uint128 local_1c8;
  uint128 local_1b8;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_200 = v.lo_;
  uVar2 = *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18);
  if ((uVar2 & 0x4a) == 8) {
    uVar9 = 0xf;
    uVar7 = 0x1000000000000000;
  }
  else if ((uVar2 & 0x4a) == 0x40) {
    uVar9 = 0x15;
    uVar7 = 0x8000000000000000;
  }
  else {
    uVar9 = 0x13;
    uVar7 = 10000000000000000000;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffbdb5 | uVar2 & 0x424a;
  local_1b8.hi_ = local_200;
  dividend_00.hi_ = local_200;
  dividend_00.lo_ = (uint64_t)os;
  divisor.hi_ = 0;
  divisor.lo_ = uVar7;
  local_1b8.lo_ = (uint64_t)os;
  anon_unknown_2::DivModImpl(dividend_00,divisor,&local_1b8,&local_1c8);
  dividend.hi_ = local_1b8.hi_;
  dividend.lo_ = local_1b8.lo_;
  divisor_00.hi_ = 0;
  divisor_00.lo_ = uVar7;
  anon_unknown_2::DivModImpl(dividend,divisor_00,&local_1b8,&local_1d8);
  if ((ostream *)local_1b8.lo_ == (ostream *)0x0) {
    if (local_1d8.lo_ != 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 & 0xfffffdff;
      lVar3 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar3 + 1] == '\0') {
        cVar4 = std::ios::widen((char)auStack_208 + (char)lVar3 + '`');
        acStack_c8[lVar3] = cVar4;
        acStack_c8[lVar3 + 1] = '\x01';
      }
      acStack_c8[lVar3] = '0';
      goto LAB_00232a4f;
    }
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    lVar3 = *(long *)(local_1a8[0] + -0x18);
    if (acStack_c8[lVar3 + 1] == '\0') {
      cVar4 = std::ios::widen((char)auStack_208 + (char)lVar3 + '`');
      acStack_c8[lVar3] = cVar4;
      acStack_c8[lVar3 + 1] = '\x01';
    }
    acStack_c8[lVar3] = '0';
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar9;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
LAB_00232a4f:
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar9;
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  lVar3 = *(long *)this;
  uVar7 = *(ulong *)(this + *(long *)(lVar3 + -0x18) + 0x10);
  *(undefined8 *)(this + *(long *)(lVar3 + -0x18) + 0x10) = 0;
  lVar8 = uVar7 - local_1f0;
  if (uVar7 < local_1f0 || lVar8 == 0) goto LAB_00232ba9;
  cVar4 = (char)lVar8;
  if (((byte)uVar2 & 0xb0) == 0x10) {
    if (((uVar2 & 0x24a) != 0x208) || (os == (ostream *)0x0 && local_200 == 0)) goto LAB_00232b60;
    paVar10 = this + *(long *)(lVar3 + -0x18);
    uVar7 = 2;
    if (this[*(long *)(lVar3 + -0x18) + 0xe1] == (absl)0x0) {
      aVar5 = (absl)std::ios::widen((char)paVar10);
      uVar7 = 2;
      goto LAB_00232b85;
    }
  }
  else {
    if ((uVar2 & 0xb0) == 0x20) {
      paVar10 = this + *(long *)(lVar3 + -0x18);
      if (this[*(long *)(lVar3 + -0x18) + 0xe1] == (absl)0x0) {
        aVar5 = (absl)std::ios::widen((char)paVar10);
        paVar10[0xe0] = aVar5;
        paVar10[0xe1] = (absl)0x1;
      }
      std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f0,0,cVar4);
      goto LAB_00232ba9;
    }
LAB_00232b60:
    paVar10 = this + *(long *)(lVar3 + -0x18);
    if (this[*(long *)(lVar3 + -0x18) + 0xe1] == (absl)0x0) {
      aVar5 = (absl)std::ios::widen((char)paVar10);
      uVar7 = 0;
LAB_00232b85:
      paVar10[0xe0] = aVar5;
      paVar10[0xe1] = (absl)0x1;
    }
    else {
      uVar7 = 0;
    }
  }
  std::__cxx11::string::insert((ulong)&local_1f8,uVar7,cVar4);
LAB_00232ba9:
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_1f8,local_1f0);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  return poVar6;
}

Assistant:

std::ostream& operator<<(std::ostream& os, uint128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep = Uint128ToFormattedString(v, flags);

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    std::ios::fmtflags adjustfield = flags & std::ios::adjustfield;
    if (adjustfield == std::ios::left) {
      rep.append(width - rep.size(), os.fill());
    } else if (adjustfield == std::ios::internal &&
               (flags & std::ios::showbase) &&
               (flags & std::ios::basefield) == std::ios::hex && v != 0) {
      rep.insert(2, width - rep.size(), os.fill());
    } else {
      rep.insert(0, width - rep.size(), os.fill());
    }
  }

  return os << rep;
}